

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

void upb_Message_DeleteUnknown(upb_Message *msg,char *data,size_t len)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  
  uVar1 = (msg->field_0).internal_opaque;
  if ((uVar1 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/message.c"
                  ,0x43,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
  }
  pcVar2 = (char *)(uVar1 + 0xc);
  if (uVar1 == 0) {
    pcVar2 = (char *)0x0;
  }
  if (data < pcVar2) {
    __assert_fail("(uintptr_t)data >= (uintptr_t)full_unknown",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/message.c"
                  ,0x4a,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
  }
  lVar3 = (ulong)*(uint *)(uVar1 + 4) - 0xc;
  if (uVar1 == 0) {
    lVar3 = 0;
  }
  if (pcVar2 + lVar3 <= data) {
    __assert_fail("(uintptr_t)data < (uintptr_t)(full_unknown + full_unknown_size)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/message.c"
                  ,0x4b,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
  }
  if ((long)len < 1) {
    __assert_fail("(uintptr_t)(data + len) > (uintptr_t)data",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/message.c"
                  ,0x4c,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
  }
  pcVar4 = (char *)(*(uint *)(uVar1 + 4) + uVar1);
  pcVar2 = data + len;
  if (pcVar2 <= pcVar4) {
    if (pcVar2 != pcVar4) {
      memmove(data,pcVar2,(long)pcVar4 - (long)pcVar2);
    }
    *(int *)(uVar1 + 4) = *(int *)(uVar1 + 4) - (int)len;
    return;
  }
  __assert_fail("(uintptr_t)(data + len) <= (uintptr_t)internal_unknown_end",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/message/message.c"
                ,0x4d,"void upb_Message_DeleteUnknown(upb_Message *, const char *, size_t)");
}

Assistant:

void upb_Message_DeleteUnknown(upb_Message* msg, const char* data, size_t len) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  const char* internal_unknown_end = UPB_PTR_AT(in, in->unknown_end, char);

#ifndef NDEBUG
  size_t full_unknown_size;
  const char* full_unknown = upb_Message_GetUnknown(msg, &full_unknown_size);
  UPB_ASSERT((uintptr_t)data >= (uintptr_t)full_unknown);
  UPB_ASSERT((uintptr_t)data < (uintptr_t)(full_unknown + full_unknown_size));
  UPB_ASSERT((uintptr_t)(data + len) > (uintptr_t)data);
  UPB_ASSERT((uintptr_t)(data + len) <= (uintptr_t)internal_unknown_end);
#endif

  if ((data + len) != internal_unknown_end) {
    memmove((char*)data, data + len, internal_unknown_end - data - len);
  }
  in->unknown_end -= len;
}